

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool Internal_IsUnsetDouble(size_t count,double *a)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  
  pdVar2 = a;
  do {
    pdVar3 = pdVar2;
    if (a + count <= pdVar3) break;
    dVar1 = *pdVar3;
    if ((dVar1 == -1.23432101234321e+308) && (!NAN(dVar1))) break;
    pdVar2 = pdVar3 + 1;
  } while ((dVar1 != 1.23432101234321e+308) || (NAN(dVar1)));
  return pdVar3 < a + count;
}

Assistant:

static bool Internal_IsUnsetDouble(
  size_t count,
  const double* a
)
{
  const double * e = a + count;
  while (a < e)
  {
    double x = *a++;
    if (ON_UNSET_VALUE == x || ON_UNSET_POSITIVE_VALUE == x)
      return true;
  }
  return false;
}